

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_39e9f3::Handlers::pushKey(Handlers *this,string *key)

{
  JSONHandler *this_00;
  shared_ptr<JSONHandler> new_jh;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::make_shared<JSONHandler>();
  this_00 = this->jh;
  std::__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_38,&local_48);
  JSONHandler::addDictKeyHandler(this_00,key,(shared_ptr<JSONHandler> *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  this->jh = local_48._M_ptr;
  std::vector<std::shared_ptr<JSONHandler>,std::allocator<std::shared_ptr<JSONHandler>>>::
  emplace_back<std::shared_ptr<JSONHandler>>
            ((vector<std::shared_ptr<JSONHandler>,std::allocator<std::shared_ptr<JSONHandler>>> *)
             this,(shared_ptr<JSONHandler> *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  return;
}

Assistant:

void
Handlers::pushKey(std::string const& key)
{
    auto new_jh = std::make_shared<JSONHandler>();
    this->jh->addDictKeyHandler(key, new_jh);
    this->jh = new_jh.get();
    this->json_handlers.emplace_back(std::move(new_jh));
}